

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackIFWInstaller.cxx
# Opt level: O0

bool __thiscall cmCPackIFWResourcesParser::ParseResource(cmCPackIFWResourcesParser *this,size_t r)

{
  reference filename;
  undefined8 uVar1;
  byte local_39;
  string local_38;
  size_t local_18;
  size_t r_local;
  cmCPackIFWResourcesParser *this_local;
  
  this->hasFiles = false;
  this->hasErrors = false;
  local_18 = r;
  r_local = (size_t)this;
  filename = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](&this->installer->Resources,r);
  cmsys::SystemTools::GetFilenamePath(&local_38,filename);
  std::__cxx11::string::operator=((string *)&this->basePath,(string *)&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator[](&this->installer->Resources,local_18);
  uVar1 = std::__cxx11::string::data();
  (*(this->super_cmXMLParser)._vptr_cmXMLParser[3])(this,uVar1);
  local_39 = 0;
  if ((this->hasFiles & 1U) != 0) {
    local_39 = this->hasErrors ^ 0xff;
  }
  return (bool)(local_39 & 1);
}

Assistant:

bool ParseResource(size_t r)
  {
    this->hasFiles = false;
    this->hasErrors = false;

    this->basePath =
      cmSystemTools::GetFilenamePath(this->installer->Resources[r]);

    this->ParseFile(this->installer->Resources[r].data());

    return this->hasFiles && !this->hasErrors;
  }